

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O2

void __thiscall MxxSort_Unique_Test::TestBody(MxxSort_Unique_Test *this)

{
  pointer piVar1;
  pointer piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  char *pcVar7;
  ulong uVar8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  AssertHelper local_1d0;
  vector<int,_std::allocator<int>_> vec;
  vector<int,_std::allocator<int>_> all;
  vector<int,_std::allocator<int>_> unique_els;
  comm c;
  AssertionResult gtest_ar;
  
  mxx::comm::comm(&c);
  std::vector<int,_std::allocator<int>_>::vector(&vec,100,(allocator_type *)&gtest_ar);
  srand(c.m_rank * 0xd);
  piVar2 = vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar1 = vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar3 = 0;
  for (puVar6 = (uint *)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; uVar4 = uVar3 % 10,
      puVar6 != (uint *)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    uVar3 = uVar3 + 1;
    *puVar6 = uVar4;
  }
  mxx::comm::comm((comm *)&gtest_ar);
  mxx::impl::
  samplesort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,false>
            (piVar1,piVar2,&gtest_ar);
  mxx::comm::~comm((comm *)&gtest_ar);
  piVar1 = vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  mxx::comm::comm((comm *)&gtest_ar);
  __last = mxx::
           unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::equal_to<int>>
                     (piVar1,vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&gtest_ar);
  mxx::comm::~comm((comm *)&gtest_ar);
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&unique_els,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,__last,(allocator_type *)&gtest_ar);
  mxx::sync_cout((sync_ostream *)&gtest_ar,&c,0);
  std::operator<<((ostream *)&gtest_ar,"[Rank ");
  std::ostream::operator<<(&gtest_ar,c.m_rank);
  std::operator<<((ostream *)&gtest_ar,"]: Found ");
  std::ostream::_M_insert<unsigned_long>((ulong)&gtest_ar);
  std::operator<<((ostream *)&gtest_ar," unique elements: ");
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&gtest_ar,&unique_els);
  std::endl<char,std::char_traits<char>>((ostream *)&gtest_ar);
  mxx::sync_basic_ostream<char,_std::char_traits<char>_>::~sync_basic_ostream
            ((sync_basic_ostream<char,_std::char_traits<char>_> *)&gtest_ar);
  mxx::comm::comm((comm *)&gtest_ar);
  mxx::allgatherv<int>(&all,&unique_els,(comm *)&gtest_ar);
  mxx::comm::~comm((comm *)&gtest_ar);
  local_1d8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa;
  local_1d0.data_ =
       (AssertHelperData *)
       ((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start >> 2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"10ul","all.size()",(unsigned_long *)&local_1d8,
             (unsigned_long *)&local_1d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
               ,0x84,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1d8);
LAB_0012c502:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar5 = 0;
    for (uVar8 = 0;
        uVar8 < (ulong)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar8 = uVar8 + 1) {
      local_1d8.ptr_._0_4_ = (int)uVar8;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"(int)i","all[i]",(int *)&local_1d8,
                 (int *)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_1d8);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
                   ,0x86,pcVar7);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1d8);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_1d8);
        goto LAB_0012c502;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      lVar5 = lVar5 + 4;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&all.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&unique_els.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vec.super__Vector_base<int,_std::allocator<int>_>);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxSort, Unique) {
    mxx::comm c;
    std::vector<int> vec(100);
    std::srand(13*c.rank());
    int i = 0;
    std::generate(vec.begin(), vec.end(), [&i](){return i++ % 10;});
    mxx::sort(vec.begin(), vec.end());
    std::vector<int>::iterator newend = mxx::unique(vec.begin(), vec.end());
    std::vector<int> unique_els(vec.begin(), newend);

    mxx::sync_cout(c) << "[Rank " << c.rank() << "]: Found " << unique_els.size() << " unique elements: " << unique_els << std::endl;

    std::vector<int> all = mxx::allgatherv(unique_els);
    ASSERT_EQ(10ul, all.size());
    for (size_t i = 0; i < all.size(); ++i) {
        ASSERT_EQ((int)i, all[i]);
    }
}